

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StructUnionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionMemberSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4)

{
  Token randomQualifier;
  Token semi;
  StructUnionMemberSyntax *this_00;
  
  this_00 = (StructUnionMemberSyntax *)allocate(this,0xb0,8);
  randomQualifier.kind = args_1->kind;
  randomQualifier._2_1_ = args_1->field_0x2;
  randomQualifier.numFlags.raw = (args_1->numFlags).raw;
  randomQualifier.rawLen = args_1->rawLen;
  randomQualifier.info = args_1->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::StructUnionMemberSyntax::StructUnionMemberSyntax
            (this_00,args,randomQualifier,args_2,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }